

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  attr_counter *paVar1;
  attr_counter *local_38;
  attr_counter *pac;
  mtree_entry_conflict *me_local;
  attr_counter *last_local;
  attr_counter *ac_local;
  attr_counter **top_local;
  
  if (ac == (attr_counter *)0x0) {
    paVar1 = attr_counter_new(me,last);
    if (paVar1 == (attr_counter *)0x0) {
      return -1;
    }
    last->next = paVar1;
  }
  else {
    ac->count = ac->count + 1;
    if ((*top == ac) || (ac->count <= ac->prev->count)) {
      return 0;
    }
    for (local_38 = ac->prev; (local_38 != (attr_counter *)0x0 && (local_38->count < ac->count));
        local_38 = local_38->prev) {
    }
    ac->prev->next = ac->next;
    if (ac->next != (attr_counter *)0x0) {
      ac->next->prev = ac->prev;
    }
    if (local_38 == (attr_counter *)0x0) {
      ac->prev = (attr_counter *)0x0;
      ac->next = *top;
      *top = ac;
      ac->next->prev = ac;
    }
    else {
      ac->prev = local_38;
      ac->next = local_38->next;
      local_38->next = ac;
      if (ac->next != (attr_counter *)0x0) {
        ac->next->prev = ac;
      }
    }
  }
  return 0;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}